

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::MatMul_x86_fma::forward
          (MatMul_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  int iVar3;
  Mat *this_00;
  size_t sVar4;
  void *pvVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  void **ppvVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  int iVar19;
  Allocator *pAVar20;
  void *pvVar21;
  pointer pMVar22;
  ulong uVar23;
  ulong uVar24;
  int *piVar25;
  size_t sVar26;
  int iVar27;
  ulong uVar28;
  Allocator *pAVar29;
  int iVar30;
  long lVar31;
  Allocator *pAVar32;
  ulong uVar33;
  void *pvVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long *plVar38;
  void *pvVar39;
  long lVar40;
  uint uVar41;
  uint uVar42;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _top_blobs;
  Mat local_1b8;
  Allocator *local_170;
  Allocator *local_168;
  Allocator *local_160;
  allocator_type local_151;
  MatMul_x86_fma *local_150;
  Mat local_148;
  Mat *local_100;
  Allocator *local_f8;
  Mat *local_f0;
  Mat local_e8;
  Option *local_a0;
  Mat local_98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_50;
  Allocator *local_38;
  
  uVar18 = local_1b8.elemsize._4_4_;
  uVar17 = (undefined4)local_1b8.elemsize;
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar1 = this_00 + 1;
  local_100 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  uVar42 = this_00->dims;
  uVar41 = this_00[1].dims;
  uVar6 = uVar41;
  if ((int)uVar41 < (int)uVar42) {
    uVar6 = uVar42;
  }
  local_150 = this;
  if ((uVar42 ^ 1) == 0 && (uVar41 ^ 1) == 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148,2,
               (allocator_type *)&local_1b8);
    Mat::reshape(&local_1b8,this_00,this_00->w,1,(Allocator *)0x0);
    pvVar39 = local_148.data;
    piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if ((Mat *)local_148.data != &local_1b8) {
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + 1;
        UNLOCK();
      }
      piVar25 = *(int **)((long)local_148.data + 8);
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 == 0) {
          if (*(Allocator **)((long)local_148.data + 0x20) == (Allocator *)0x0) {
            if (*(void **)local_148.data != (void *)0x0) {
              free(*(void **)local_148.data);
            }
          }
          else {
            (*(*(Allocator **)((long)local_148.data + 0x20))->_vptr_Allocator[3])();
          }
        }
      }
      *(size_t *)((long)pvVar39 + 0x40) = 0;
      *(void **)pvVar39 = (void *)0x0;
      *(int **)((long)pvVar39 + 8) = (int *)0x0;
      *(undefined8 *)((long)((long)pvVar39 + 8) + 4) = 0;
      *(undefined8 *)((long)((long)pvVar39 + 0x10) + 4) = 0;
      *(undefined8 *)((long)pvVar39 + 0x28) = 0;
      *(undefined8 *)((long)pvVar39 + 0x30) = 0;
      *(int *)((long)pvVar39 + 0x38) = 0;
      piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      *(void **)pvVar39 = local_1b8.data;
      *(int **)((long)pvVar39 + 8) =
           (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      *(size_t *)((long)pvVar39 + 0x10) =
           CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
      *(int *)((long)pvVar39 + 0x18) = local_1b8.elempack;
      *(Allocator **)((long)pvVar39 + 0x20) = local_1b8.allocator;
      *(ulong *)((long)pvVar39 + 0x28) = CONCAT44(local_1b8.w,local_1b8.dims);
      *(ulong *)((long)pvVar39 + 0x30) = CONCAT44(local_1b8.d,local_1b8.h);
      *(int *)((long)pvVar39 + 0x38) = local_1b8.c;
      *(size_t *)((long)pvVar39 + 0x40) = local_1b8.cstep;
    }
    if (piVar25 != (int *)0x0) {
      LOCK();
      *piVar25 = *piVar25 + -1;
      UNLOCK();
      if (*piVar25 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar27 = 1;
    iVar2 = this_00[1].w;
    if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86_fma[-3]) == 0) {
      iVar27 = this_00[1].w;
      iVar2 = 1;
    }
    Mat::reshape(&local_1b8,pMVar1,iVar2,iVar27,(Allocator *)0x0);
    pMVar1 = local_100;
    piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if ((Mat *)((long)local_148.data + 0x48) != &local_1b8) {
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + 1;
        UNLOCK();
      }
      piVar25 = ((Mat *)((long)local_148.data + 0x48))->refcount;
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 == 0) {
          if (((Mat *)((long)local_148.data + 0x48))->allocator == (Allocator *)0x0) {
            if (((Mat *)((long)local_148.data + 0x48))->data != (void *)0x0) {
              free(((Mat *)((long)local_148.data + 0x48))->data);
            }
          }
          else {
            (*((Mat *)((long)local_148.data + 0x48))->allocator->_vptr_Allocator[3])();
          }
        }
      }
      piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      ((Mat *)((long)local_148.data + 0x48))->data = local_1b8.data;
      ((Mat *)((long)local_148.data + 0x48))->refcount =
           (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      ((Mat *)((long)local_148.data + 0x48))->elemsize =
           CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
      ((Mat *)((long)local_148.data + 0x48))->elempack = local_1b8.elempack;
      ((Mat *)((long)local_148.data + 0x48))->allocator = local_1b8.allocator;
      ((Mat *)((long)local_148.data + 0x48))->dims = local_1b8.dims;
      ((Mat *)((long)local_148.data + 0x48))->w = local_1b8.w;
      ((Mat *)((long)local_148.data + 0x48))->h = local_1b8.h;
      ((Mat *)((long)local_148.data + 0x48))->d = local_1b8.d;
      ((Mat *)((long)local_148.data + 0x48))->c = local_1b8.c;
      ((Mat *)((long)local_148.data + 0x48))->cstep = local_1b8.cstep;
    }
    if (piVar25 != (int *)0x0) {
      LOCK();
      *piVar25 = *piVar25 + -1;
      UNLOCK();
      if (*piVar25 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_148,top_blobs,opt);
    Mat::reshape(&local_1b8,pMVar1,1,opt->blob_allocator);
    piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (pMVar1 != &local_1b8) {
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + 1;
        UNLOCK();
      }
      piVar25 = pMVar1->refcount;
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 == 0) {
          if (pMVar1->allocator == (Allocator *)0x0) {
            if (pMVar1->data != (void *)0x0) {
              free(pMVar1->data);
            }
          }
          else {
            (*pMVar1->allocator->_vptr_Allocator[3])();
          }
        }
      }
      piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      pMVar1->data = local_1b8.data;
      pMVar1->refcount = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      pMVar1->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
      pMVar1->elempack = local_1b8.elempack;
      pMVar1->allocator = local_1b8.allocator;
      pMVar1->dims = local_1b8.dims;
      pMVar1->w = local_1b8.w;
      pMVar1->h = local_1b8.h;
      pMVar1->d = local_1b8.d;
      pMVar1->c = local_1b8.c;
      pMVar1->cstep = local_1b8.cstep;
    }
    if (piVar25 == (int *)0x0) goto LAB_0052d24e;
    LOCK();
    *piVar25 = *piVar25 + -1;
    UNLOCK();
    if (*piVar25 != 0) goto LAB_0052d24e;
    if (local_1b8.allocator != (Allocator *)0x0) {
      (*(local_1b8.allocator)->_vptr_Allocator[3])();
      goto LAB_0052d24e;
    }
  }
  else {
    if ((uVar42 ^ 2) == 0 && (uVar41 ^ 2) == 0) {
      (*this->gemm->_vptr_Layer[6])(this->gemm,bottom_blobs,top_blobs,opt);
      return 0;
    }
    if ((uVar42 ^ 1) == 0 && (uVar41 ^ 2) == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148,2,
                 (allocator_type *)&local_1b8);
      Mat::reshape(&local_1b8,this_00,this_00->w,1,(Allocator *)0x0);
      pMVar1 = local_100;
      pvVar39 = local_148.data;
      piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if ((Mat *)local_148.data != &local_1b8) {
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = *(int **)((long)local_148.data + 8);
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 == 0) {
            if (*(Allocator **)((long)local_148.data + 0x20) == (Allocator *)0x0) {
              if (*(void **)local_148.data != (void *)0x0) {
                free(*(void **)local_148.data);
              }
            }
            else {
              (*(*(Allocator **)((long)local_148.data + 0x20))->_vptr_Allocator[3])();
            }
          }
        }
        *(size_t *)((long)pvVar39 + 0x40) = 0;
        *(void **)pvVar39 = (void *)0x0;
        *(int **)((long)pvVar39 + 8) = (int *)0x0;
        *(undefined8 *)((long)((long)pvVar39 + 8) + 4) = 0;
        *(undefined8 *)((long)((long)pvVar39 + 0x10) + 4) = 0;
        *(undefined8 *)((long)pvVar39 + 0x28) = 0;
        *(undefined8 *)((long)pvVar39 + 0x30) = 0;
        *(int *)((long)pvVar39 + 0x38) = 0;
        piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        *(void **)pvVar39 = local_1b8.data;
        *(int **)((long)pvVar39 + 8) =
             (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        *(size_t *)((long)pvVar39 + 0x10) =
             CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
        *(int *)((long)pvVar39 + 0x18) = local_1b8.elempack;
        *(Allocator **)((long)pvVar39 + 0x20) = local_1b8.allocator;
        *(ulong *)((long)pvVar39 + 0x28) = CONCAT44(local_1b8.w,local_1b8.dims);
        *(ulong *)((long)pvVar39 + 0x30) = CONCAT44(local_1b8.d,local_1b8.h);
        *(int *)((long)pvVar39 + 0x38) = local_1b8.c;
        *(size_t *)((long)pvVar39 + 0x40) = local_1b8.cstep;
      }
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if ((Mat *)local_148.data != this_00) {
        piVar25 = this_00[1].refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = ((Mat *)((long)local_148.data + 0x48))->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 == 0) {
            if (((Mat *)((long)local_148.data + 0x48))->allocator == (Allocator *)0x0) {
              if (((Mat *)((long)local_148.data + 0x48))->data != (void *)0x0) {
                free(((Mat *)((long)local_148.data + 0x48))->data);
              }
            }
            else {
              (*((Mat *)((long)local_148.data + 0x48))->allocator->_vptr_Allocator[3])();
            }
          }
        }
        ((Mat *)((long)local_148.data + 0x48))->cstep = 0;
        *(undefined8 *)((long)&((Mat *)((long)local_148.data + 0x48))->refcount + 4) = 0;
        *(undefined8 *)((long)&((Mat *)((long)local_148.data + 0x48))->elemsize + 4) = 0;
        ((Mat *)((long)local_148.data + 0x48))->data = (void *)0x0;
        ((Mat *)((long)local_148.data + 0x48))->refcount = (int *)0x0;
        ((Mat *)((long)local_148.data + 0x48))->dims = 0;
        ((Mat *)((long)local_148.data + 0x48))->w = 0;
        ((Mat *)((long)local_148.data + 0x48))->h = 0;
        ((Mat *)((long)local_148.data + 0x48))->d = 0;
        ((Mat *)((long)local_148.data + 0x48))->c = 0;
        piVar25 = this_00[1].refcount;
        ((Mat *)((long)local_148.data + 0x48))->data = this_00[1].data;
        ((Mat *)((long)local_148.data + 0x48))->refcount = piVar25;
        ((Mat *)((long)local_148.data + 0x48))->elemsize = this_00[1].elemsize;
        ((Mat *)((long)local_148.data + 0x48))->elempack = this_00[1].elempack;
        ((Mat *)((long)local_148.data + 0x48))->allocator = this_00[1].allocator;
        iVar2 = this_00[1].w;
        iVar27 = this_00[1].h;
        iVar30 = this_00[1].d;
        ((Mat *)((long)local_148.data + 0x48))->dims = this_00[1].dims;
        ((Mat *)((long)local_148.data + 0x48))->w = iVar2;
        ((Mat *)((long)local_148.data + 0x48))->h = iVar27;
        ((Mat *)((long)local_148.data + 0x48))->d = iVar30;
        ((Mat *)((long)local_148.data + 0x48))->c = this_00[1].c;
        ((Mat *)((long)local_148.data + 0x48))->cstep = this_00[1].cstep;
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_148,top_blobs,opt);
      Mat::reshape(&local_1b8,pMVar1,pMVar1->w,opt->blob_allocator);
      piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (pMVar1 != &local_1b8) {
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = pMVar1->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 == 0) {
            if (pMVar1->allocator == (Allocator *)0x0) {
              if (pMVar1->data != (void *)0x0) {
                free(pMVar1->data);
              }
            }
            else {
              (*pMVar1->allocator->_vptr_Allocator[3])();
            }
          }
        }
        piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        pMVar1->data = local_1b8.data;
        pMVar1->refcount = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        pMVar1->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
        pMVar1->elempack = local_1b8.elempack;
        pMVar1->allocator = local_1b8.allocator;
        pMVar1->dims = local_1b8.dims;
        pMVar1->w = local_1b8.w;
        pMVar1->h = local_1b8.h;
        pMVar1->d = local_1b8.d;
        pMVar1->c = local_1b8.c;
        pMVar1->cstep = local_1b8.cstep;
      }
      if (piVar25 == (int *)0x0) goto LAB_0052d24e;
      LOCK();
      *piVar25 = *piVar25 + -1;
      UNLOCK();
      if (*piVar25 != 0) goto LAB_0052d24e;
      if (local_1b8.allocator != (Allocator *)0x0) {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
        goto LAB_0052d24e;
      }
    }
    else {
      if ((uVar42 ^ 2) != 0 || (uVar41 ^ 1) != 0) {
        sVar4 = this_00->elemsize;
        local_a0 = opt;
        if ((int)uVar41 < 3 || uVar42 != 1) {
          if ((int)uVar42 < 3 || uVar41 != 1) {
            local_1b8.elemsize._0_4_ = (undefined4)sVar4;
            local_1b8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
            if (uVar6 == 4) {
              if (uVar42 == 3) {
                local_1b8.elemsize._0_4_ = uVar17;
                local_1b8.elemsize._4_4_ = uVar18;
                Mat::reshape(&local_1b8,this_00,this_00->w,this_00->h,this_00->c,1,(Allocator *)0x0)
                ;
              }
              else {
                piVar25 = this_00->refcount;
                local_1b8.data = this_00->data;
                local_1b8.refcount._0_4_ = SUB84(this_00->refcount,0);
                local_1b8.refcount._4_4_ = (undefined4)((ulong)this_00->refcount >> 0x20);
                local_1b8.elempack = this_00->elempack;
                local_1b8.allocator = this_00->allocator;
                uVar12 = this_00->w;
                uVar13 = this_00->h;
                uVar14 = this_00->d;
                uVar15 = this_00->c;
                local_1b8.cstep = this_00->cstep;
                local_1b8.dims = uVar42;
                local_1b8.w = uVar12;
                local_1b8.h = uVar13;
                local_1b8.d = uVar14;
                local_1b8.c = uVar15;
                if (piVar25 != (int *)0x0) {
                  LOCK();
                  *piVar25 = *piVar25 + 1;
                  UNLOCK();
                }
              }
              if (uVar41 == 3) {
                Mat::reshape(&local_148,pMVar1,this_00[1].w,this_00[1].h,this_00[1].c,1,
                             (Allocator *)0x0);
              }
              else {
                piVar25 = this_00[1].refcount;
                local_148.data = this_00[1].data;
                local_148.refcount = this_00[1].refcount;
                local_148.elemsize = this_00[1].elemsize;
                local_148.elempack = this_00[1].elempack;
                local_148.allocator = this_00[1].allocator;
                local_148.dims = this_00[1].dims;
                local_148.w = this_00[1].w;
                local_148.h = this_00[1].h;
                local_148.d = this_00[1].d;
                local_148.c = this_00[1].c;
                local_148.cstep = this_00[1].cstep;
                if (piVar25 != (int *)0x0) {
                  LOCK();
                  *piVar25 = *piVar25 + 1;
                  UNLOCK();
                }
              }
              pMVar1 = local_100;
              iVar2 = local_148.d;
              if (local_148.d < local_1b8.d) {
                iVar2 = local_1b8.d;
              }
              uVar42 = local_148.c;
              if (local_148.c < local_1b8.c) {
                uVar42 = local_1b8.c;
              }
              local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar2);
              Mat::create(local_100,
                          (&local_148.w)
                          [*(int *)(&local_150->field_0xd0 +
                                   (long)local_150->_vptr_MatMul_x86_fma[-3]) != 0],local_1b8.h,
                          iVar2,uVar42,sVar4,opt->blob_allocator);
              if ((pMVar1->data == (void *)0x0) || ((long)pMVar1->c * pMVar1->cstep == 0)) {
                if (local_148.refcount != (int *)0x0) {
                  LOCK();
                  *local_148.refcount = *local_148.refcount + -1;
                  UNLOCK();
                  if (*local_148.refcount == 0) {
                    if (local_148.allocator == (Allocator *)0x0) {
                      if ((Mat *)local_148.data != (Mat *)0x0) {
                        free(local_148.data);
                      }
                    }
                    else {
                      (*(local_148.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
                if (piVar25 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar25 = *piVar25 + -1;
                UNLOCK();
                if (*piVar25 != 0) {
                  return -100;
                }
                if (local_1b8.allocator != (Allocator *)0x0) {
                  (*(local_1b8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
                goto LAB_0052df96;
              }
              if (0 < (int)uVar42) {
                local_38 = (Allocator *)(ulong)uVar42;
                uVar33 = (ulong)local_f0 & 0xffffffff;
                local_160 = (Allocator *)0x0;
                do {
                  if (0 < (int)local_f0) {
                    pAVar29 = (Allocator *)((ulong)local_160 & 0xffffffff);
                    local_168 = pAVar29;
                    if (local_1b8.c == 1) {
                      local_168 = (Allocator *)0x0;
                    }
                    if (local_148.c == 1) {
                      pAVar29 = (Allocator *)0x0;
                    }
                    uVar23 = 0;
                    do {
                      iVar36 = local_1b8.d;
                      local_170 = (Allocator *)CONCAT44(local_170._4_4_,local_148.d);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98,2,
                                 (allocator_type *)&local_e8);
                      pvVar34 = local_98.data;
                      iVar30 = local_1b8.h;
                      iVar27 = local_1b8.w;
                      iVar2 = local_1b8.elempack;
                      pvVar39 = local_1b8.data;
                      lVar31 = (long)local_1b8.w;
                      lVar37 = (long)local_1b8.h;
                      lVar40 = local_1b8.cstep * (long)local_168;
                      lVar35 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
                      uVar24 = 0;
                      if (iVar36 != 1) {
                        uVar24 = uVar23 & 0xffffffff;
                      }
                      piVar25 = *(int **)((long)local_98.data + 8);
                      pAVar32 = local_1b8.allocator;
                      if (piVar25 != (int *)0x0) {
                        LOCK();
                        *piVar25 = *piVar25 + -1;
                        UNLOCK();
                        if (*piVar25 == 0) {
                          if (*(long **)((long)local_98.data + 0x20) == (long *)0x0) {
                            if (*local_98.data != (void *)0x0) {
                              local_f8 = local_1b8.allocator;
                              free(*local_98.data);
                              pAVar32 = local_f8;
                            }
                          }
                          else {
                            local_f8 = local_1b8.allocator;
                            (**(code **)(**(long **)((long)local_98.data + 0x20) + 0x18))();
                            pAVar32 = local_f8;
                          }
                        }
                      }
                      pvVar21 = local_98.data;
                      pAVar20 = local_148.allocator;
                      iVar36 = local_148.elempack;
                      sVar4 = local_148.elemsize;
                      pvVar5 = local_148.data;
                      *(ulong *)pvVar34 =
                           (long)pvVar39 + uVar24 * lVar37 * lVar31 * lVar35 + lVar40 * lVar35;
                      *(long *)((long)pvVar34 + 8) = 0;
                      *(long *)((long)pvVar34 + 0x10) = lVar35;
                      *(int *)((long)pvVar34 + 0x18) = iVar2;
                      *(Allocator **)((long)pvVar34 + 0x20) = pAVar32;
                      *(undefined4 *)((long)pvVar34 + 0x28) = 2;
                      *(int *)((long)pvVar34 + 0x2c) = iVar27;
                      *(int *)((long)pvVar34 + 0x30) = iVar30;
                      *(undefined8 *)((long)pvVar34 + 0x34) = 0x100000001;
                      *(long *)((long)pvVar34 + 0x40) = lVar37 * lVar31;
                      pAVar32 = (Allocator *)(long)local_148.w;
                      iVar2 = local_148.h;
                      lVar31 = (long)local_148.h;
                      lVar35 = local_148.cstep * (long)pAVar29 * local_148.elemsize;
                      piVar25 = *(int **)((long)local_98.data + 0x50);
                      uVar24 = uVar23 & 0xffffffff;
                      if ((int)local_170 == 1) {
                        uVar24 = 0;
                      }
                      if (piVar25 != (int *)0x0) {
                        LOCK();
                        *piVar25 = *piVar25 + -1;
                        UNLOCK();
                        if (*piVar25 == 0) {
                          if (*(long **)((long)local_98.data + 0x68) == (long *)0x0) {
                            if (*(void **)((long)local_98.data + 0x48) != (void *)0x0) {
                              local_170 = pAVar32;
                              free(*(void **)((long)local_98.data + 0x48));
                              pAVar32 = local_170;
                            }
                          }
                          else {
                            local_170 = pAVar32;
                            (**(code **)(**(long **)((long)local_98.data + 0x68) + 0x18))();
                            pAVar32 = local_170;
                          }
                        }
                      }
                      *(ulong *)((long)pvVar21 + 0x48) =
                           (long)(void **)pvVar5 + uVar24 * lVar31 * (long)pAVar32 * sVar4 + lVar35;
                      *(long *)((long)pvVar21 + 0x50) = 0;
                      *(size_t *)((long)pvVar21 + 0x58) = sVar4;
                      *(int *)((long)pvVar21 + 0x60) = iVar36;
                      *(Allocator **)((long)pvVar21 + 0x68) = pAVar20;
                      *(undefined4 *)((long)pvVar21 + 0x70) = 2;
                      *(int *)((long)pvVar21 + 0x74) = (int)pAVar32;
                      *(int *)((long)pvVar21 + 0x78) = iVar2;
                      *(undefined8 *)((long)pvVar21 + 0x7c) = 0x100000001;
                      *(long *)((long)pvVar21 + 0x88) = lVar31 * (long)pAVar32;
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8,1,
                                 (allocator_type *)&local_50);
                      pvVar34 = local_e8.data;
                      iVar2 = local_100->w;
                      iVar27 = local_100->h;
                      lVar35 = local_100->cstep * (long)local_160;
                      sVar4 = local_100->elemsize;
                      pvVar39 = local_100->data;
                      iVar30 = local_100->elempack;
                      pAVar32 = local_100->allocator;
                      piVar25 = *(int **)((long)local_e8.data + 8);
                      if (piVar25 != (int *)0x0) {
                        LOCK();
                        *piVar25 = *piVar25 + -1;
                        UNLOCK();
                        if (*piVar25 == 0) {
                          if (*(Allocator **)((long)local_e8.data + 0x20) == (Allocator *)0x0) {
                            if (*(void **)local_e8.data != (void *)0x0) {
                              local_170 = (Allocator *)CONCAT44(local_170._4_4_,iVar30);
                              free(*(void **)local_e8.data);
                              iVar30 = (int)local_170;
                            }
                          }
                          else {
                            local_170 = (Allocator *)CONCAT44(local_170._4_4_,iVar30);
                            (*(*(Allocator **)((long)local_e8.data + 0x20))->_vptr_Allocator[3])();
                            iVar30 = (int)local_170;
                          }
                        }
                      }
                      sVar26 = (long)iVar27 * (long)iVar2;
                      *(void **)pvVar34 =
                           (void *)((long)pvVar39 + uVar23 * sVar4 * sVar26 + lVar35 * sVar4);
                      *(int **)((long)pvVar34 + 8) = (int *)0x0;
                      *(size_t *)((long)pvVar34 + 0x10) = sVar4;
                      *(int *)((long)pvVar34 + 0x18) = iVar30;
                      *(Allocator **)((long)pvVar34 + 0x20) = pAVar32;
                      *(int *)((long)pvVar34 + 0x28) = 2;
                      *(int *)((long)pvVar34 + 0x2c) = iVar2;
                      *(int *)((long)pvVar34 + 0x30) = iVar27;
                      *(undefined8 *)((long)pvVar34 + 0x34) = 0x100000001;
                      *(size_t *)((long)pvVar34 + 0x40) = sVar26;
                      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_98,&local_e8);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98);
                      uVar23 = uVar23 + 1;
                    } while (uVar33 != uVar23);
                  }
                  local_160 = (Allocator *)((long)&local_160->_vptr_Allocator + 1);
                } while (local_160 != local_38);
              }
              if (local_148.refcount != (int *)0x0) {
                LOCK();
                *local_148.refcount = *local_148.refcount + -1;
                UNLOCK();
                if (*local_148.refcount == 0) {
                  if (local_148.allocator == (Allocator *)0x0) {
                    if ((Mat *)local_148.data != (Mat *)0x0) {
                      free(local_148.data);
                    }
                  }
                  else {
                    (*(local_148.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
              if (piVar25 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar25 = *piVar25 + -1;
              UNLOCK();
              if (*piVar25 != 0) {
                return 0;
              }
              if (local_1b8.allocator != (Allocator *)0x0) {
                (*(local_1b8.allocator)->_vptr_Allocator[3])();
                return 0;
              }
            }
            else {
              if (uVar6 != 3) {
                forward();
                return -1;
              }
              if (uVar42 == 2) {
                local_1b8.elemsize._0_4_ = uVar17;
                local_1b8.elemsize._4_4_ = uVar18;
                Mat::reshape(&local_1b8,this_00,this_00->w,this_00->h,1,(Allocator *)0x0);
              }
              else {
                piVar25 = this_00->refcount;
                local_1b8.data = this_00->data;
                local_1b8.refcount._0_4_ = SUB84(this_00->refcount,0);
                local_1b8.refcount._4_4_ = (undefined4)((ulong)this_00->refcount >> 0x20);
                local_1b8.elempack = this_00->elempack;
                local_1b8.allocator = this_00->allocator;
                uVar8 = this_00->w;
                uVar9 = this_00->h;
                uVar10 = this_00->d;
                uVar11 = this_00->c;
                local_1b8.cstep = this_00->cstep;
                local_1b8.dims = uVar42;
                local_1b8.w = uVar8;
                local_1b8.h = uVar9;
                local_1b8.d = uVar10;
                local_1b8.c = uVar11;
                if (piVar25 != (int *)0x0) {
                  LOCK();
                  *piVar25 = *piVar25 + 1;
                  UNLOCK();
                }
              }
              if (uVar41 == 2) {
                Mat::reshape(&local_148,pMVar1,this_00[1].w,this_00[1].h,1,(Allocator *)0x0);
              }
              else {
                piVar25 = this_00[1].refcount;
                local_148.data = this_00[1].data;
                local_148.refcount = this_00[1].refcount;
                local_148.elemsize = this_00[1].elemsize;
                local_148.elempack = this_00[1].elempack;
                local_148.allocator = this_00[1].allocator;
                local_148.dims = this_00[1].dims;
                local_148.w = this_00[1].w;
                local_148.h = this_00[1].h;
                local_148.d = this_00[1].d;
                local_148.c = this_00[1].c;
                local_148.cstep = this_00[1].cstep;
                if (piVar25 != (int *)0x0) {
                  LOCK();
                  *piVar25 = *piVar25 + 1;
                  UNLOCK();
                }
              }
              pMVar1 = local_100;
              uVar42 = local_148.c;
              if (local_148.c < local_1b8.c) {
                uVar42 = local_1b8.c;
              }
              Mat::create(local_100,
                          (&local_148.w)
                          [*(int *)(&local_150->field_0xd0 +
                                   (long)local_150->_vptr_MatMul_x86_fma[-3]) != 0],local_1b8.h,
                          uVar42,sVar4,opt->blob_allocator);
              if ((pMVar1->data == (void *)0x0) || ((long)pMVar1->c * pMVar1->cstep == 0)) {
                if (local_148.refcount != (int *)0x0) {
                  LOCK();
                  *local_148.refcount = *local_148.refcount + -1;
                  UNLOCK();
                  if (*local_148.refcount == 0) {
                    if (local_148.allocator == (Allocator *)0x0) {
                      if ((Mat *)local_148.data != (Mat *)0x0) {
                        free(local_148.data);
                      }
                    }
                    else {
                      (*(local_148.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
                if (piVar25 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar25 = *piVar25 + -1;
                UNLOCK();
                if (*piVar25 != 0) {
                  return -100;
                }
                if (local_1b8.allocator != (Allocator *)0x0) {
                  (*(local_1b8.allocator)->_vptr_Allocator[3])();
                  return -100;
                }
LAB_0052df96:
                if (local_1b8.data != (void *)0x0) {
                  free(local_1b8.data);
                }
                return -100;
              }
              if (0 < (int)uVar42) {
                local_168 = (Allocator *)(ulong)uVar42;
                local_170 = (Allocator *)0x0;
                do {
                  iVar19 = local_1b8.c;
                  local_160 = (Allocator *)CONCAT44(local_160._4_4_,local_148.c);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98,2,
                             (allocator_type *)&local_e8);
                  pvVar39 = local_98.data;
                  iVar3 = local_1b8.d;
                  iVar36 = local_1b8.h;
                  iVar30 = local_1b8.w;
                  iVar27 = local_1b8.dims;
                  pAVar29 = local_1b8.allocator;
                  iVar2 = local_1b8.elempack;
                  uVar33 = (ulong)local_170 & 0xffffffff;
                  if (iVar19 == 1) {
                    uVar33 = 0;
                  }
                  uVar23 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
                  pvVar34 = (void *)(uVar33 * local_1b8.cstep * uVar23 + (long)local_1b8.data);
                  uVar33 = (uVar23 * (long)local_1b8.h * (long)local_1b8.w + 0xf &
                           0xfffffffffffffff0) / uVar23;
                  if (local_1b8.dims == 4) {
                    uVar33 = (long)local_1b8.h * (long)local_1b8.w;
                  }
                  piVar25 = *(int **)((long)local_98.data + 8);
                  if (piVar25 != (int *)0x0) {
                    LOCK();
                    *piVar25 = *piVar25 + -1;
                    UNLOCK();
                    if (*piVar25 == 0) {
                      if (*(long **)((long)local_98.data + 0x20) == (long *)0x0) {
                        if (*local_98.data != (void *)0x0) {
                          free(*local_98.data);
                        }
                      }
                      else {
                        (**(code **)(**(long **)((long)local_98.data + 0x20) + 0x18))();
                      }
                    }
                  }
                  pvVar5 = local_98.data;
                  pAVar32 = local_148.allocator;
                  iVar19 = local_148.elempack;
                  sVar4 = local_148.elemsize;
                  uVar24 = (ulong)local_170 & 0xffffffff;
                  *(void **)pvVar39 = pvVar34;
                  *(long *)((long)pvVar39 + 8) = 0;
                  *(ulong *)((long)pvVar39 + 0x10) = uVar23;
                  *(int *)((long)pvVar39 + 0x18) = iVar2;
                  *(Allocator **)((long)pvVar39 + 0x20) = pAVar29;
                  *(uint *)((long)pvVar39 + 0x28) = iVar27 - 1;
                  *(int *)((long)pvVar39 + 0x2c) = iVar30;
                  *(int *)((long)pvVar39 + 0x30) = iVar36;
                  *(undefined4 *)((long)pvVar39 + 0x34) = 1;
                  *(int *)((long)pvVar39 + 0x38) = iVar3;
                  *(ulong *)((long)pvVar39 + 0x40) = uVar33;
                  iVar27 = local_148.w;
                  iVar30 = local_148.h;
                  iVar2 = local_148.dims;
                  if ((int)local_160 == 1) {
                    uVar24 = 0;
                  }
                  lVar35 = uVar24 * local_148.cstep * local_148.elemsize;
                  ppvVar16 = (void **)local_148.data;
                  uVar23 = local_148.elemsize * (long)local_148.h * (long)local_148.w + 0xf &
                           0xfffffffffffffff0;
                  uVar33 = uVar23 / local_148.elemsize;
                  if (local_148.dims == 4) {
                    uVar33 = (long)local_148.h * (long)local_148.w;
                  }
                  piVar25 = *(int **)((long)local_98.data + 0x50);
                  iVar36 = local_148.d;
                  if (piVar25 != (int *)0x0) {
                    LOCK();
                    *piVar25 = *piVar25 + -1;
                    UNLOCK();
                    if (*piVar25 == 0) {
                      pvVar39 = *(void **)((long)local_98.data + 0x48);
                      plVar38 = *(long **)((long)local_98.data + 0x68);
                      if (plVar38 == (long *)0x0) {
                        if (pvVar39 != (void *)0x0) {
                          local_160 = (Allocator *)CONCAT44(local_160._4_4_,local_148.d);
                          free(pvVar39);
                          iVar36 = (int)local_160;
                        }
                      }
                      else {
                        local_160 = (Allocator *)CONCAT44(local_160._4_4_,local_148.d);
                        (**(code **)(*plVar38 + 0x18))(plVar38,pvVar39,uVar23 % local_148.elemsize);
                        iVar36 = (int)local_160;
                      }
                    }
                  }
                  *(void ***)((long)pvVar5 + 0x48) = (void **)((long)ppvVar16 + lVar35);
                  *(long *)((long)pvVar5 + 0x50) = 0;
                  *(size_t *)((long)pvVar5 + 0x58) = sVar4;
                  *(int *)((long)pvVar5 + 0x60) = iVar19;
                  *(Allocator **)((long)pvVar5 + 0x68) = pAVar32;
                  *(int *)((long)pvVar5 + 0x70) = iVar2 + -1;
                  *(int *)((long)pvVar5 + 0x74) = iVar27;
                  *(int *)((long)pvVar5 + 0x78) = iVar30;
                  *(undefined4 *)((long)pvVar5 + 0x7c) = 1;
                  *(int *)((long)pvVar5 + 0x80) = iVar36;
                  *(ulong *)((long)pvVar5 + 0x88) = uVar33;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8,1,
                             (allocator_type *)&local_50);
                  pvVar34 = local_e8.data;
                  iVar2 = local_100->w;
                  iVar27 = local_100->h;
                  iVar30 = local_100->d;
                  lVar35 = local_100->cstep * (long)local_170;
                  uVar33 = local_100->elemsize;
                  pvVar39 = local_100->data;
                  iVar36 = local_100->elempack;
                  pAVar29 = local_100->allocator;
                  uVar28 = (long)iVar27 * (long)iVar2;
                  uVar24 = uVar28 * uVar33 + 0xf & 0xfffffffffffffff0;
                  iVar3 = local_100->dims;
                  uVar23 = uVar24 / uVar33;
                  if (iVar3 == 4) {
                    uVar23 = uVar28;
                  }
                  piVar25 = *(int **)((long)local_e8.data + 8);
                  if (piVar25 != (int *)0x0) {
                    LOCK();
                    *piVar25 = *piVar25 + -1;
                    UNLOCK();
                    if (*piVar25 == 0) {
                      pvVar5 = *(void **)local_e8.data;
                      pAVar32 = *(Allocator **)((long)local_e8.data + 0x20);
                      if (pAVar32 == (Allocator *)0x0) {
                        if (pvVar5 != (void *)0x0) {
                          local_160 = (Allocator *)CONCAT44(local_160._4_4_,iVar30);
                          free(pvVar5);
                          iVar30 = (int)local_160;
                        }
                      }
                      else {
                        local_160 = (Allocator *)CONCAT44(local_160._4_4_,iVar30);
                        (*pAVar32->_vptr_Allocator[3])(pAVar32,pvVar5,uVar24 % uVar33);
                        iVar30 = (int)local_160;
                      }
                    }
                  }
                  *(void **)pvVar34 = (void *)(lVar35 * uVar33 + (long)pvVar39);
                  *(int **)((long)pvVar34 + 8) = (int *)0x0;
                  *(ulong *)((long)pvVar34 + 0x10) = uVar33;
                  *(int *)((long)pvVar34 + 0x18) = iVar36;
                  *(Allocator **)((long)pvVar34 + 0x20) = pAVar29;
                  *(int *)((long)pvVar34 + 0x28) = iVar3 + -1;
                  *(int *)((long)pvVar34 + 0x2c) = iVar2;
                  *(int *)((long)pvVar34 + 0x30) = iVar27;
                  *(int *)((long)pvVar34 + 0x34) = 1;
                  *(int *)((long)pvVar34 + 0x38) = iVar30;
                  *(ulong *)((long)pvVar34 + 0x40) = uVar23;
                  (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_98,&local_e8,local_a0);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98);
                  local_170 = (Allocator *)((long)&local_170->_vptr_Allocator + 1);
                } while (local_168 != local_170);
              }
              if (local_148.refcount != (int *)0x0) {
                LOCK();
                *local_148.refcount = *local_148.refcount + -1;
                UNLOCK();
                if (*local_148.refcount == 0) {
                  if (local_148.allocator == (Allocator *)0x0) {
                    if ((Mat *)local_148.data != (Mat *)0x0) {
                      free(local_148.data);
                    }
                  }
                  else {
                    (*(local_148.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
              if (piVar25 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar25 = *piVar25 + -1;
              UNLOCK();
              if (*piVar25 != 0) {
                return 0;
              }
              if (local_1b8.allocator != (Allocator *)0x0) {
                (*(local_1b8.allocator)->_vptr_Allocator[3])();
                return 0;
              }
            }
            goto LAB_0052e410;
          }
          uVar41 = this_00->c * this_00->d;
          local_1b8.cstep = 0;
          local_1b8.data = (void *)0x0;
          local_1b8.refcount._0_4_ = 0;
          local_1b8.refcount._4_4_ = 0;
          local_1b8.elemsize._0_4_ = 0;
          local_1b8.elemsize._4_4_ = 0;
          local_1b8.elempack = 0;
          local_1b8.allocator = (Allocator *)0x0;
          local_1b8.dims = 0;
          local_1b8.w = 0;
          local_1b8.h = 0;
          local_1b8.d = 0;
          local_1b8.c = 0;
          local_f8 = (Allocator *)CONCAT44(local_f8._4_4_,this_00->h);
          Mat::create(&local_1b8,1,this_00->h,uVar41,sVar4,opt->blob_allocator);
          if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0)) {
            piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
            if (piVar25 == (int *)0x0) {
              return -100;
            }
            LOCK();
            *piVar25 = *piVar25 + -1;
            UNLOCK();
            if (*piVar25 != 0) {
              return -100;
            }
            if (local_1b8.allocator != (Allocator *)0x0) {
              (*(local_1b8.allocator)->_vptr_Allocator[3])();
              return -100;
            }
            goto LAB_0052df96;
          }
          Mat::reshape(&local_148,this_00,this_00->w,this_00->h,uVar41,(Allocator *)0x0);
          iVar27 = 1;
          iVar2 = this_00[1].w;
          if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86_fma[-3]) == 0) {
            iVar27 = this_00[1].w;
            iVar2 = 1;
          }
          local_f0 = this_00;
          Mat::reshape(&local_98,pMVar1,iVar2,iVar27,(Allocator *)0x0);
          if (0 < (int)uVar41) {
            local_160 = (Allocator *)(ulong)uVar41;
            pAVar29 = (Allocator *)0x0;
            do {
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8,2,
                         (allocator_type *)&local_50);
              pvVar39 = local_e8.data;
              iVar2 = local_148.elempack;
              sVar4 = local_148.elemsize;
              iVar30 = local_148.w;
              iVar36 = local_148.h;
              iVar3 = local_148.d;
              lVar35 = local_148.cstep * (long)pAVar29 * local_148.elemsize;
              ppvVar16 = (void **)local_148.data;
              uVar23 = local_148.elemsize * (long)local_148.h * (long)local_148.w + 0xf &
                       0xfffffffffffffff0;
              iVar27 = local_148.dims;
              uVar33 = uVar23 / local_148.elemsize;
              if (local_148.dims == 4) {
                uVar33 = (long)local_148.h * (long)local_148.w;
              }
              piVar25 = *(int **)((long)local_e8.data + 8);
              pAVar32 = local_148.allocator;
              local_170 = pAVar29;
              if (piVar25 != (int *)0x0) {
                LOCK();
                *piVar25 = *piVar25 + -1;
                UNLOCK();
                if (*piVar25 == 0) {
                  local_168 = local_148.allocator;
                  pvVar34 = *(void **)local_e8.data;
                  pAVar29 = *(Allocator **)((long)local_e8.data + 0x20);
                  if (pAVar29 == (Allocator *)0x0) {
                    if (pvVar34 != (void *)0x0) {
                      free(pvVar34);
                      pAVar32 = local_168;
                    }
                  }
                  else {
                    (*pAVar29->_vptr_Allocator[3])(pAVar29,pvVar34,uVar23 % local_148.elemsize);
                    pAVar32 = local_168;
                  }
                }
              }
              pvVar34 = local_e8.data;
              pAVar29 = local_170;
              *(void **)pvVar39 = (void **)((long)ppvVar16 + lVar35);
              *(int **)((long)pvVar39 + 8) = (int *)0x0;
              *(size_t *)((long)pvVar39 + 0x10) = sVar4;
              *(int *)((long)pvVar39 + 0x18) = iVar2;
              *(Allocator **)((long)pvVar39 + 0x20) = pAVar32;
              *(int *)((long)pvVar39 + 0x28) = iVar27 + -1;
              *(int *)((long)pvVar39 + 0x2c) = iVar30;
              *(int *)((long)pvVar39 + 0x30) = iVar36;
              *(int *)((long)pvVar39 + 0x34) = 1;
              *(int *)((long)pvVar39 + 0x38) = iVar3;
              *(ulong *)((long)pvVar39 + 0x40) = uVar33;
              if ((Mat *)((long)local_e8.data + 0x48) != &local_98) {
                if (local_98.refcount != (int *)0x0) {
                  LOCK();
                  *local_98.refcount = *local_98.refcount + 1;
                  UNLOCK();
                }
                piVar25 = ((Mat *)((long)local_e8.data + 0x48))->refcount;
                if (piVar25 != (int *)0x0) {
                  LOCK();
                  *piVar25 = *piVar25 + -1;
                  UNLOCK();
                  if (*piVar25 == 0) {
                    if (((Mat *)((long)local_e8.data + 0x48))->allocator == (Allocator *)0x0) {
                      if (((Mat *)((long)local_e8.data + 0x48))->data != (void *)0x0) {
                        free(((Mat *)((long)local_e8.data + 0x48))->data);
                      }
                    }
                    else {
                      (*((Mat *)((long)local_e8.data + 0x48))->allocator->_vptr_Allocator[3])();
                    }
                  }
                }
                ((Mat *)((long)pvVar34 + 0x48))->data = local_98.data;
                ((Mat *)((long)pvVar34 + 0x48))->refcount = local_98.refcount;
                ((Mat *)((long)pvVar34 + 0x48))->elemsize = local_98.elemsize;
                ((Mat *)((long)pvVar34 + 0x48))->elempack = local_98.elempack;
                ((Mat *)((long)pvVar34 + 0x48))->allocator = local_98.allocator;
                ((Mat *)((long)pvVar34 + 0x48))->dims = local_98.dims;
                ((Mat *)((long)pvVar34 + 0x48))->w = local_98.w;
                ((Mat *)((long)pvVar34 + 0x48))->h = local_98.h;
                ((Mat *)((long)pvVar34 + 0x48))->d = local_98.d;
                ((Mat *)((long)pvVar34 + 0x48))->c = local_98.c;
                ((Mat *)((long)pvVar34 + 0x48))->cstep = local_98.cstep;
              }
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&local_50,1,&local_151);
              pMVar22 = local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar3 = local_1b8.d;
              iVar36 = local_1b8.h;
              iVar30 = local_1b8.w;
              iVar27 = local_1b8.dims;
              iVar2 = local_1b8.elempack;
              uVar33 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
              pvVar39 = (void *)(local_1b8.cstep * (long)pAVar29 * uVar33 + (long)local_1b8.data);
              uVar24 = uVar33 * (long)local_1b8.h * (long)local_1b8.w + 0xf & 0xfffffffffffffff0;
              uVar23 = uVar24 / uVar33;
              if (local_1b8.dims == 4) {
                uVar23 = (long)local_1b8.h * (long)local_1b8.w;
              }
              piVar25 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start)->refcount;
              pAVar29 = local_1b8.allocator;
              if (piVar25 != (int *)0x0) {
                LOCK();
                *piVar25 = *piVar25 + -1;
                UNLOCK();
                if (*piVar25 == 0) {
                  local_168 = local_1b8.allocator;
                  pvVar34 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data;
                  pAVar32 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator;
                  if (pAVar32 == (Allocator *)0x0) {
                    if (pvVar34 != (void *)0x0) {
                      free(pvVar34);
                      pAVar29 = local_168;
                    }
                  }
                  else {
                    (*pAVar32->_vptr_Allocator[3])(pAVar32,pvVar34,uVar24 % uVar33);
                    pAVar29 = local_168;
                  }
                }
              }
              opt = local_a0;
              pMVar22->data = pvVar39;
              pMVar22->refcount = (int *)0x0;
              pMVar22->elemsize = uVar33;
              pMVar22->elempack = iVar2;
              pMVar22->allocator = pAVar29;
              pMVar22->dims = iVar27 - 1;
              pMVar22->w = iVar30;
              pMVar22->h = iVar36;
              pMVar22->d = 1;
              pMVar22->c = iVar3;
              pMVar22->cstep = uVar23;
              (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_e8,&local_50,local_a0);
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_50);
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8);
              pAVar29 = (Allocator *)((long)&local_170->_vptr_Allocator + 1);
            } while (local_160 != pAVar29);
          }
          pMVar1 = local_100;
          if (uVar42 == 3) {
            Mat::reshape(&local_e8,&local_1b8,(int)local_f8,local_f0->c * local_f0->d,
                         opt->blob_allocator);
            if (pMVar1 != &local_e8) {
              if (local_e8.refcount != (int *)0x0) {
                LOCK();
                *local_e8.refcount = *local_e8.refcount + 1;
                UNLOCK();
              }
              piVar25 = pMVar1->refcount;
              if (piVar25 != (int *)0x0) {
                LOCK();
                *piVar25 = *piVar25 + -1;
                UNLOCK();
                if (*piVar25 == 0) {
                  if (pMVar1->allocator == (Allocator *)0x0) {
                    if (pMVar1->data != (void *)0x0) {
                      free(pMVar1->data);
                    }
                  }
                  else {
                    (*pMVar1->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar1->data = local_e8.data;
              pMVar1->refcount = local_e8.refcount;
              pMVar1->elemsize = local_e8.elemsize;
              pMVar1->elempack = local_e8.elempack;
              pMVar1->allocator = local_e8.allocator;
              pMVar1->dims = local_e8.dims;
              pMVar1->w = local_e8.w;
              pMVar1->h = local_e8.h;
              pMVar1->d = local_e8.d;
              pMVar1->c = local_e8.c;
              pMVar1->cstep = local_e8.cstep;
            }
            if (local_e8.refcount != (int *)0x0) {
              LOCK();
              *local_e8.refcount = *local_e8.refcount + -1;
              UNLOCK();
              if (*local_e8.refcount == 0) {
                if (local_e8.allocator == (Allocator *)0x0) {
LAB_0052e35a:
                  if ((Mat *)local_e8.data != (Mat *)0x0) {
                    free(local_e8.data);
                  }
                }
                else {
                  (*(local_e8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            Mat::reshape(&local_e8,&local_1b8,(int)local_f8,local_f0->d,local_f0->c,
                         opt->blob_allocator);
            if (pMVar1 != &local_e8) {
              if (local_e8.refcount != (int *)0x0) {
                LOCK();
                *local_e8.refcount = *local_e8.refcount + 1;
                UNLOCK();
              }
              piVar25 = pMVar1->refcount;
              if (piVar25 != (int *)0x0) {
                LOCK();
                *piVar25 = *piVar25 + -1;
                UNLOCK();
                if (*piVar25 == 0) {
                  if (pMVar1->allocator == (Allocator *)0x0) {
                    if (pMVar1->data != (void *)0x0) {
                      free(pMVar1->data);
                    }
                  }
                  else {
                    (*pMVar1->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar1->data = local_e8.data;
              pMVar1->refcount = local_e8.refcount;
              pMVar1->elemsize = local_e8.elemsize;
              pMVar1->elempack = local_e8.elempack;
              pMVar1->allocator = local_e8.allocator;
              pMVar1->dims = local_e8.dims;
              pMVar1->w = local_e8.w;
              pMVar1->h = local_e8.h;
              pMVar1->d = local_e8.d;
              pMVar1->c = local_e8.c;
              pMVar1->cstep = local_e8.cstep;
            }
            if (local_e8.refcount != (int *)0x0) {
              LOCK();
              *local_e8.refcount = *local_e8.refcount + -1;
              UNLOCK();
              if (*local_e8.refcount == 0) {
                if (local_e8.allocator == (Allocator *)0x0) goto LAB_0052e35a;
                (*(local_e8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + -1;
            UNLOCK();
            if (*local_98.refcount == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                if ((long *)local_98.data != (long *)0x0) {
                  free(local_98.data);
                }
              }
              else {
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_148.refcount != (int *)0x0) {
            LOCK();
            *local_148.refcount = *local_148.refcount + -1;
            UNLOCK();
            if (*local_148.refcount == 0) {
              if (local_148.allocator == (Allocator *)0x0) {
                if ((Mat *)local_148.data != (Mat *)0x0) {
                  free(local_148.data);
                }
              }
              else {
                (*(local_148.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          if (piVar25 == (int *)0x0) {
            return 0;
          }
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 != 0) {
            return 0;
          }
          if (local_1b8.allocator != (Allocator *)0x0) {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
            return 0;
          }
          goto LAB_0052e410;
        }
        uVar42 = this_00[1].c * this_00[1].d;
        local_1b8.cstep = 0;
        local_1b8.data = (void *)0x0;
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = 0;
        local_1b8.elemsize._4_4_ = 0;
        local_1b8.elempack = 0;
        local_1b8.allocator = (Allocator *)0x0;
        local_1b8.dims = 0;
        local_1b8.w = 0;
        local_1b8.h = 0;
        local_1b8.d = 0;
        local_1b8.c = 0;
        local_f8 = (Allocator *)
                   CONCAT44(local_f8._4_4_,
                            (&this_00[1].w)
                            [*(int *)(&this->field_0xd0 + (long)this->_vptr_MatMul_x86_fma[-3]) != 0
                            ]);
        Mat::create(&local_1b8,
                    (&this_00[1].w)
                    [*(int *)(&this->field_0xd0 + (long)this->_vptr_MatMul_x86_fma[-3]) != 0],1,
                    uVar42,sVar4,opt->blob_allocator);
        if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0)) {
          piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          if (piVar25 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 != 0) {
            return -100;
          }
          if (local_1b8.allocator != (Allocator *)0x0) {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
            return -100;
          }
          goto LAB_0052df96;
        }
        Mat::reshape(&local_148,this_00,this_00->w,1,(Allocator *)0x0);
        local_f0 = this_00;
        Mat::reshape(&local_98,pMVar1,this_00[1].w,this_00[1].h,uVar42,(Allocator *)0x0);
        if (0 < (int)uVar42) {
          local_160 = (Allocator *)(ulong)uVar42;
          pAVar29 = (Allocator *)0x0;
          do {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8,2,
                       (allocator_type *)&local_50);
            pvVar39 = local_e8.data;
            if ((Mat *)local_e8.data != &local_148) {
              if (local_148.refcount != (int *)0x0) {
                LOCK();
                *local_148.refcount = *local_148.refcount + 1;
                UNLOCK();
              }
              piVar25 = *(int **)((long)local_e8.data + 8);
              if (piVar25 != (int *)0x0) {
                LOCK();
                *piVar25 = *piVar25 + -1;
                UNLOCK();
                if (*piVar25 == 0) {
                  if (*(Allocator **)((long)local_e8.data + 0x20) == (Allocator *)0x0) {
                    if (*(void **)local_e8.data != (void *)0x0) {
                      free(*(void **)local_e8.data);
                    }
                  }
                  else {
                    (*(*(Allocator **)((long)local_e8.data + 0x20))->_vptr_Allocator[3])();
                  }
                }
              }
              *(size_t *)((long)pvVar39 + 0x40) = 0;
              *(void **)pvVar39 = (void *)0x0;
              *(int **)((long)pvVar39 + 8) = (int *)0x0;
              *(undefined8 *)((long)((long)pvVar39 + 8) + 4) = 0;
              *(undefined8 *)((long)((long)pvVar39 + 0x10) + 4) = 0;
              *(undefined8 *)((long)pvVar39 + 0x28) = 0;
              *(undefined8 *)((long)pvVar39 + 0x30) = 0;
              *(int *)((long)pvVar39 + 0x38) = 0;
              *(void **)pvVar39 = local_148.data;
              *(int **)((long)pvVar39 + 8) = local_148.refcount;
              *(size_t *)((long)pvVar39 + 0x10) = local_148.elemsize;
              *(int *)((long)pvVar39 + 0x18) = local_148.elempack;
              *(Allocator **)((long)pvVar39 + 0x20) = local_148.allocator;
              *(undefined8 *)((long)pvVar39 + 0x28) = local_148._40_8_;
              *(undefined8 *)((long)pvVar39 + 0x30) = local_148._48_8_;
              *(int *)((long)pvVar39 + 0x38) = local_148.c;
              *(size_t *)((long)pvVar39 + 0x40) = local_148.cstep;
            }
            iVar3 = local_98.d;
            iVar36 = local_98.h;
            iVar30 = local_98.w;
            iVar27 = local_98.dims;
            iVar2 = local_98.elempack;
            sVar4 = local_98.elemsize;
            pvVar39 = local_e8.data;
            plVar38 = (long *)((long)local_98.data +
                              local_98.cstep * (long)pAVar29 * local_98.elemsize);
            uVar23 = local_98.elemsize * (long)local_98.h * (long)local_98.w + 0xf &
                     0xfffffffffffffff0;
            uVar33 = uVar23 / local_98.elemsize;
            if (local_98.dims == 4) {
              uVar33 = (long)local_98.h * (long)local_98.w;
            }
            piVar25 = ((Mat *)((long)local_e8.data + 0x48))->refcount;
            pAVar32 = local_98.allocator;
            local_170 = pAVar29;
            if (piVar25 != (int *)0x0) {
              LOCK();
              *piVar25 = *piVar25 + -1;
              UNLOCK();
              if (*piVar25 == 0) {
                local_168 = local_98.allocator;
                pvVar34 = ((Mat *)((long)local_e8.data + 0x48))->data;
                pAVar29 = ((Mat *)((long)local_e8.data + 0x48))->allocator;
                if (pAVar29 == (Allocator *)0x0) {
                  if (pvVar34 != (void *)0x0) {
                    free(pvVar34);
                    pAVar32 = local_168;
                  }
                }
                else {
                  (*pAVar29->_vptr_Allocator[3])(pAVar29,pvVar34,uVar23 % local_98.elemsize);
                  pAVar32 = local_168;
                }
              }
            }
            ((Mat *)((long)pvVar39 + 0x48))->data = plVar38;
            ((Mat *)((long)pvVar39 + 0x48))->refcount = (int *)0x0;
            ((Mat *)((long)pvVar39 + 0x48))->elemsize = sVar4;
            ((Mat *)((long)pvVar39 + 0x48))->elempack = iVar2;
            ((Mat *)((long)pvVar39 + 0x48))->allocator = pAVar32;
            ((Mat *)((long)pvVar39 + 0x48))->dims = iVar27 + -1;
            ((Mat *)((long)pvVar39 + 0x48))->w = iVar30;
            ((Mat *)((long)pvVar39 + 0x48))->h = iVar36;
            ((Mat *)((long)pvVar39 + 0x48))->d = 1;
            ((Mat *)((long)pvVar39 + 0x48))->c = iVar3;
            ((Mat *)((long)pvVar39 + 0x48))->cstep = uVar33;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&local_50,1,&local_151);
            pMVar22 = local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar3 = local_1b8.d;
            iVar36 = local_1b8.h;
            iVar30 = local_1b8.w;
            iVar27 = local_1b8.dims;
            iVar2 = local_1b8.elempack;
            uVar33 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
            pvVar39 = (void *)(local_1b8.cstep * (long)local_170 * uVar33 + (long)local_1b8.data);
            uVar24 = uVar33 * (long)local_1b8.h * (long)local_1b8.w + 0xf & 0xfffffffffffffff0;
            uVar23 = uVar24 / uVar33;
            if (local_1b8.dims == 4) {
              uVar23 = (long)local_1b8.h * (long)local_1b8.w;
            }
            piVar25 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->refcount;
            pAVar29 = local_1b8.allocator;
            if (piVar25 != (int *)0x0) {
              LOCK();
              *piVar25 = *piVar25 + -1;
              UNLOCK();
              if (*piVar25 == 0) {
                local_168 = local_1b8.allocator;
                pvVar34 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->data;
                pAVar32 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator;
                if (pAVar32 == (Allocator *)0x0) {
                  if (pvVar34 != (void *)0x0) {
                    free(pvVar34);
                    pAVar29 = local_168;
                  }
                }
                else {
                  (*pAVar32->_vptr_Allocator[3])(pAVar32,pvVar34,uVar24 % uVar33);
                  pAVar29 = local_168;
                }
              }
            }
            opt = local_a0;
            pMVar22->data = pvVar39;
            pMVar22->refcount = (int *)0x0;
            pMVar22->elemsize = uVar33;
            pMVar22->elempack = iVar2;
            pMVar22->allocator = pAVar29;
            pMVar22->dims = iVar27 - 1;
            pMVar22->w = iVar30;
            pMVar22->h = iVar36;
            pMVar22->d = 1;
            pMVar22->c = iVar3;
            pMVar22->cstep = uVar23;
            (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_e8,&local_50,local_a0);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_50);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8);
            pAVar29 = (Allocator *)((long)&local_170->_vptr_Allocator + 1);
          } while (local_160 != pAVar29);
        }
        pMVar1 = local_100;
        if (uVar41 == 3) {
          Mat::reshape(&local_e8,&local_1b8,(int)local_f8,local_f0[1].c * local_f0[1].d,
                       opt->blob_allocator);
          if (pMVar1 != &local_e8) {
            if (local_e8.refcount != (int *)0x0) {
              LOCK();
              *local_e8.refcount = *local_e8.refcount + 1;
              UNLOCK();
            }
            piVar25 = pMVar1->refcount;
            if (piVar25 != (int *)0x0) {
              LOCK();
              *piVar25 = *piVar25 + -1;
              UNLOCK();
              if (*piVar25 == 0) {
                if (pMVar1->allocator == (Allocator *)0x0) {
                  if (pMVar1->data != (void *)0x0) {
                    free(pMVar1->data);
                  }
                }
                else {
                  (*pMVar1->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar1->data = local_e8.data;
            pMVar1->refcount = local_e8.refcount;
            pMVar1->elemsize = local_e8.elemsize;
            pMVar1->elempack = local_e8.elempack;
            pMVar1->allocator = local_e8.allocator;
            pMVar1->dims = local_e8.dims;
            pMVar1->w = local_e8.w;
            pMVar1->h = local_e8.h;
            pMVar1->d = local_e8.d;
            pMVar1->c = local_e8.c;
            pMVar1->cstep = local_e8.cstep;
          }
          if (local_e8.refcount != (int *)0x0) {
            LOCK();
            *local_e8.refcount = *local_e8.refcount + -1;
            UNLOCK();
            if (*local_e8.refcount == 0) {
              if (local_e8.allocator == (Allocator *)0x0) {
LAB_0052e0ef:
                if ((Mat *)local_e8.data != (Mat *)0x0) {
                  free(local_e8.data);
                }
              }
              else {
                (*(local_e8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          Mat::reshape(&local_e8,&local_1b8,(int)local_f8,local_f0[1].d,local_f0[1].c,
                       opt->blob_allocator);
          if (pMVar1 != &local_e8) {
            if (local_e8.refcount != (int *)0x0) {
              LOCK();
              *local_e8.refcount = *local_e8.refcount + 1;
              UNLOCK();
            }
            piVar25 = pMVar1->refcount;
            if (piVar25 != (int *)0x0) {
              LOCK();
              *piVar25 = *piVar25 + -1;
              UNLOCK();
              if (*piVar25 == 0) {
                if (pMVar1->allocator == (Allocator *)0x0) {
                  if (pMVar1->data != (void *)0x0) {
                    free(pMVar1->data);
                  }
                }
                else {
                  (*pMVar1->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar1->data = local_e8.data;
            pMVar1->refcount = local_e8.refcount;
            pMVar1->elemsize = local_e8.elemsize;
            pMVar1->elempack = local_e8.elempack;
            pMVar1->allocator = local_e8.allocator;
            pMVar1->dims = local_e8.dims;
            pMVar1->w = local_e8.w;
            pMVar1->h = local_e8.h;
            pMVar1->d = local_e8.d;
            pMVar1->c = local_e8.c;
            pMVar1->cstep = local_e8.cstep;
          }
          if (local_e8.refcount != (int *)0x0) {
            LOCK();
            *local_e8.refcount = *local_e8.refcount + -1;
            UNLOCK();
            if (*local_e8.refcount == 0) {
              if (local_e8.allocator == (Allocator *)0x0) goto LAB_0052e0ef;
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + -1;
          UNLOCK();
          if (*local_98.refcount == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if ((long *)local_98.data != (long *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_148.refcount != (int *)0x0) {
          LOCK();
          *local_148.refcount = *local_148.refcount + -1;
          UNLOCK();
          if (*local_148.refcount == 0) {
            if (local_148.allocator == (Allocator *)0x0) {
              if ((Mat *)local_148.data != (Mat *)0x0) {
                free(local_148.data);
              }
            }
            else {
              (*(local_148.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar25 == (int *)0x0) {
          return 0;
        }
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 != 0) {
          return 0;
        }
        if (local_1b8.allocator != (Allocator *)0x0) {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
          return 0;
        }
LAB_0052e410:
        if (local_1b8.data == (void *)0x0) {
          return 0;
        }
        free(local_1b8.data);
        return 0;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148,2,
                 (allocator_type *)&local_1b8);
      pvVar39 = local_148.data;
      if ((Mat *)local_148.data != this_00) {
        piVar25 = this_00->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = *(int **)((long)local_148.data + 8);
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 == 0) {
            if (*(Allocator **)((long)local_148.data + 0x20) == (Allocator *)0x0) {
              if (*(void **)local_148.data != (void *)0x0) {
                free(*(void **)local_148.data);
              }
            }
            else {
              (*(*(Allocator **)((long)local_148.data + 0x20))->_vptr_Allocator[3])();
            }
          }
        }
        *(size_t *)((long)pvVar39 + 0x40) = 0;
        *(void **)pvVar39 = (void *)0x0;
        *(int **)((long)pvVar39 + 8) = (int *)0x0;
        *(undefined8 *)((long)((long)pvVar39 + 8) + 4) = 0;
        *(undefined8 *)((long)((long)pvVar39 + 0x10) + 4) = 0;
        *(undefined8 *)((long)pvVar39 + 0x28) = 0;
        *(undefined8 *)((long)pvVar39 + 0x30) = 0;
        *(int *)((long)pvVar39 + 0x38) = 0;
        piVar25 = this_00->refcount;
        *(void **)pvVar39 = this_00->data;
        *(int **)((long)pvVar39 + 8) = piVar25;
        *(size_t *)((long)pvVar39 + 0x10) = this_00->elemsize;
        *(int *)((long)pvVar39 + 0x18) = this_00->elempack;
        *(Allocator **)((long)pvVar39 + 0x20) = this_00->allocator;
        uVar7 = *(undefined8 *)&this_00->h;
        *(undefined8 *)((long)pvVar39 + 0x28) = *(undefined8 *)&this_00->dims;
        *(undefined8 *)((long)pvVar39 + 0x30) = uVar7;
        *(int *)((long)pvVar39 + 0x38) = this_00->c;
        *(size_t *)((long)pvVar39 + 0x40) = this_00->cstep;
      }
      iVar27 = 1;
      iVar2 = this_00[1].w;
      if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86_fma[-3]) == 0) {
        iVar27 = this_00[1].w;
        iVar2 = 1;
      }
      Mat::reshape(&local_1b8,pMVar1,iVar2,iVar27,(Allocator *)0x0);
      piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if ((Mat *)((long)local_148.data + 0x48) != &local_1b8) {
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = ((Mat *)((long)local_148.data + 0x48))->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 == 0) {
            if (((Mat *)((long)local_148.data + 0x48))->allocator == (Allocator *)0x0) {
              if (((Mat *)((long)local_148.data + 0x48))->data != (void *)0x0) {
                free(((Mat *)((long)local_148.data + 0x48))->data);
              }
            }
            else {
              (*((Mat *)((long)local_148.data + 0x48))->allocator->_vptr_Allocator[3])();
            }
          }
        }
        piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        ((Mat *)((long)local_148.data + 0x48))->data = local_1b8.data;
        ((Mat *)((long)local_148.data + 0x48))->refcount =
             (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        ((Mat *)((long)local_148.data + 0x48))->elemsize =
             CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
        ((Mat *)((long)local_148.data + 0x48))->elempack = local_1b8.elempack;
        ((Mat *)((long)local_148.data + 0x48))->allocator = local_1b8.allocator;
        ((Mat *)((long)local_148.data + 0x48))->dims = local_1b8.dims;
        ((Mat *)((long)local_148.data + 0x48))->w = local_1b8.w;
        ((Mat *)((long)local_148.data + 0x48))->h = local_1b8.h;
        ((Mat *)((long)local_148.data + 0x48))->d = local_1b8.d;
        ((Mat *)((long)local_148.data + 0x48))->c = local_1b8.c;
        ((Mat *)((long)local_148.data + 0x48))->cstep = local_1b8.cstep;
      }
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_148,top_blobs,opt);
      pMVar1 = local_100;
      Mat::reshape(&local_1b8,local_100,local_100->h,opt->blob_allocator);
      piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (pMVar1 != &local_1b8) {
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = pMVar1->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 == 0) {
            if (pMVar1->allocator == (Allocator *)0x0) {
              if (pMVar1->data != (void *)0x0) {
                free(pMVar1->data);
              }
            }
            else {
              (*pMVar1->allocator->_vptr_Allocator[3])();
            }
          }
        }
        piVar25 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        pMVar1->data = local_1b8.data;
        pMVar1->refcount = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        pMVar1->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
        pMVar1->elempack = local_1b8.elempack;
        pMVar1->allocator = local_1b8.allocator;
        pMVar1->dims = local_1b8.dims;
        pMVar1->w = local_1b8.w;
        pMVar1->h = local_1b8.h;
        pMVar1->d = local_1b8.d;
        pMVar1->c = local_1b8.c;
        pMVar1->cstep = local_1b8.cstep;
      }
      if (piVar25 == (int *)0x0) goto LAB_0052d24e;
      LOCK();
      *piVar25 = *piVar25 + -1;
      UNLOCK();
      if (*piVar25 != 0) goto LAB_0052d24e;
      if (local_1b8.allocator != (Allocator *)0x0) {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
        goto LAB_0052d24e;
      }
    }
  }
  if (local_1b8.data != (void *)0x0) {
    free(local_1b8.data);
  }
LAB_0052d24e:
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148);
  return 0;
}

Assistant:

int MatMul_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int Adims = A.dims;
    const int Bdims = B.dims;
    const int max_ABdims = std::max(Adims, Bdims);
    const size_t elemsize = A.elemsize;

    if (Adims == 1 && Bdims == 1)
    {
        // dot product
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(1, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 2)
    {
        // matrix multiply
        gemm->forward(bottom_blobs, top_blobs, opt);
    }
    else if (Adims == 1 && Bdims == 2)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = B;
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.w, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 1)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A;
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.h, opt.blob_allocator);
    }
    else if (Adims == 1 && Bdims > 2)
    {
        // batched matrix multiply
        const int N = transB == 0 ? B.w : B.h;
        const int batch_size = B.d * B.c;

        Mat top_blob1(N, 1, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, 1);
        Mat B1 = B.reshape(B.w, B.h, batch_size);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1;
            _bottom_blobs[1] = B1.channel(p);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Bdims == 3)
            top_blob = top_blob1.reshape(N, B.d * B.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(N, B.d, B.c, opt.blob_allocator);
    }
    else if (Adims > 2 && Bdims == 1)
    {
        // batched matrix multiply
        const int M = A.h;
        const int batch_size = A.d * A.c;

        Mat top_blob1(1, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, A.h, batch_size);
        Mat BT = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(p);
            _bottom_blobs[1] = BT;
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Adims == 3)
            top_blob = top_blob1.reshape(M, A.d * A.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(M, A.d, A.c, opt.blob_allocator);
    }
    else if (max_ABdims == 3)
    {
        Mat A1 = Adims == 2 ? A.reshape(A.w, A.h, 1) : A;
        Mat B1 = Bdims == 2 ? B.reshape(B.w, B.h, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(Ap);
            _bottom_blobs[1] = B1.channel(Bp);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }
    }
    else if (max_ABdims == 4)
    {
        Mat A1 = Adims == 3 ? A.reshape(A.w, A.h, A.c, 1) : A;
        Mat B1 = Bdims == 3 ? B.reshape(B.w, B.h, B.c, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size_d = std::max(A1.d, B1.d);
        const int batch_size_c = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size_d, batch_size_c, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size_c; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            for (int q = 0; q < batch_size_d; q++)
            {
                int Ad = A1.d == 1 ? 0 : q;
                int Bd = B1.d == 1 ? 0 : q;

                std::vector<Mat> _bottom_blobs(2);
                _bottom_blobs[0] = A1.channel(Ap).depth(Ad);
                _bottom_blobs[1] = B1.channel(Bp).depth(Bd);
                std::vector<Mat> _top_blobs(1);
                _top_blobs[0] = top_blob.channel(p).depth(q);
                gemm->forward(_bottom_blobs, _top_blobs, opt);
            }
        }
    }
    else
    {
        NCNN_LOGE("impossible matmul %d %d", Adims, Bdims);
        return -1;
    }

    return 0;
}